

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

Var Js::JavascriptString::CallRegExFunction<1>
              (RecyclableObject *fnObj,Var regExp,Arguments *args,ScriptContext *scriptContext)

{
  ThreadContext *this;
  Var pvVar1;
  anon_class_40_4_a3bf5f9f local_58;
  ThreadContext *local_30;
  ThreadContext *threadContext;
  ScriptContext *scriptContext_local;
  Arguments *args_local;
  Var regExp_local;
  RecyclableObject *fnObj_local;
  
  threadContext = (ThreadContext *)scriptContext;
  scriptContext_local = (ScriptContext *)args;
  args_local = (Arguments *)regExp;
  regExp_local = fnObj;
  this = ScriptContext::GetThreadContext(scriptContext);
  pvVar1 = regExp_local;
  local_58.fnObj = (RecyclableObject *)regExp_local;
  local_58.regExp = args_local;
  local_58.threadContext = this;
  local_30 = this;
  Arguments::Arguments(&local_58.args,(Arguments *)scriptContext_local);
  pvVar1 = ThreadContext::
           ExecuteImplicitCall<Js::JavascriptString::CallRegExFunction<1>(Js::RecyclableObject*,void*,Js::Arguments&,Js::ScriptContext*)::__0>
                     (this,(RecyclableObject *)pvVar1,ImplicitCall_Accessor,&local_58);
  return pvVar1;
}

Assistant:

Var JavascriptString::CallRegExFunction<1>(RecyclableObject* fnObj, Var regExp, Arguments& args, ScriptContext *scriptContext)
    {
        // args[0]: String
        ThreadContext * threadContext = scriptContext->GetThreadContext();
        return threadContext->ExecuteImplicitCall(fnObj, ImplicitCall_Accessor, [=]()->Js::Var
        {
            return CALL_FUNCTION(threadContext, fnObj, CallInfo(CallFlags_Value, 2), regExp, args[0]);
        });
    }